

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_image.c
# Opt level: O1

int jas_image_fmtfromname(char *name)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  char **ppcVar4;
  
  pcVar2 = strrchr(name,0x2e);
  if ((pcVar2 != (char *)0x0) && (0 < jas_image_numfmts)) {
    ppcVar4 = &jas_image_fmtinfos[0].ext;
    iVar3 = jas_image_numfmts;
    do {
      iVar1 = strcmp(pcVar2 + 1,*ppcVar4);
      if (iVar1 == 0) {
        return ((jas_image_fmtinfo_t *)(ppcVar4 + -2))->id;
      }
      ppcVar4 = ppcVar4 + 7;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  return -1;
}

Assistant:

int jas_image_fmtfromname(const char *name)
{
	int i;
	const char *ext;
	const jas_image_fmtinfo_t *fmtinfo;
	/* Get the file name extension. */
	if (!(ext = strrchr(name, '.'))) {
		return -1;
	}
	++ext;
	/* Try to find a format that uses this extension. */	
	for (i = 0, fmtinfo = jas_image_fmtinfos; i < jas_image_numfmts; ++i,
	  ++fmtinfo) {
		/* Do we have a match? */
		if (!strcmp(ext, fmtinfo->ext)) {
			return fmtinfo->id;
		}
	}
	return -1;
}